

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_write_extensions(znzFile fp,nifti_image *nim)

{
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  nifti1_extension *buffer;
  size_t sStack_40;
  undefined4 uStack_38;
  char extdr [4];
  
  _uStack_38 = in_RAX & 0xffffffff;
  iVar1 = (int)CONCAT71((int7)(in_RAX >> 8),fp == (znzFile)0x0);
  if ((nim == (nifti_image *)0x0 || fp == (znzFile)0x0) || (iVar1 = nim->num_ext, iVar1 < 0)) {
    if (0 < g_opts_0) {
      pcVar6 = "** nifti_write_extensions, bad params\n";
      sStack_40 = 0x26;
LAB_00112bd3:
      sVar4 = fwrite(pcVar6,sStack_40,1,_stderr);
      return (int)sVar4;
    }
  }
  else if ((g_opts_1 == 0) || ((iVar1 != 0 && (nim->ext_list != (nifti1_extension *)0x0)))) {
    iVar1 = valid_nifti_extensions(nim);
    if (iVar1 == 0) {
      nim->num_ext = 0;
    }
    else if (0 < nim->num_ext) {
      _uStack_38 = CONCAT14(1,uStack_38);
    }
    sVar3 = nifti_write_buffer(fp,extdr,4);
    if (sVar3 == 4) {
      buffer = nim->ext_list;
      uVar5 = 0;
      sVar3 = 4;
      while( true ) {
        iVar1 = (int)sVar3;
        uVar2 = nim->num_ext;
        if ((int)uVar2 <= (int)uVar5) break;
        sVar3 = nifti_write_buffer(fp,buffer,4);
        if ((int)sVar3 != 4) {
LAB_00112bea:
          pcVar6 = "** failed while writing extension #%d\n";
          uVar2 = uVar5;
          goto LAB_00112bf7;
        }
        sVar3 = nifti_write_buffer(fp,&buffer->ecode,4);
        if ((int)sVar3 != 4) goto LAB_00112bea;
        sVar3 = nifti_write_buffer(fp,buffer->edata,(long)buffer->esize - 8);
        if (buffer->esize + -8 != (int)sVar3) goto LAB_00112bea;
        if (2 < g_opts_0) {
          uVar2 = fprintf(_stderr,"+d wrote extension %d of %d bytes\n",(ulong)uVar5,
                          sVar3 & 0xffffffff);
          sVar3 = (size_t)uVar2;
        }
        uVar5 = uVar5 + 1;
        buffer = buffer + 1;
      }
      if (1 < g_opts_0) {
        pcVar6 = "+d wrote out %d extension(s)\n";
LAB_00112bf7:
        iVar1 = fprintf(_stderr,pcVar6,(ulong)uVar2);
      }
    }
    else {
      sVar4 = fwrite("** failed to write extender\n",0x1c,1,_stderr);
      iVar1 = (int)sVar4;
    }
  }
  else if (1 < g_opts_0) {
    pcVar6 = "-d no exts and skip_blank_ext set, so skipping 4-byte extender\n";
    sStack_40 = 0x3f;
    goto LAB_00112bd3;
  }
  return iVar1;
}

Assistant:

static int nifti_write_extensions(znzFile fp, nifti_image *nim)
{
   nifti1_extension * list;
   char               extdr[4] = { 0, 0, 0, 0 };
   int                c, size, ok = 1;

   if( znz_isnull(fp) || !nim || nim->num_ext < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_write_extensions, bad params\n");
      return -1;
   }

   /* if no extensions and user requests it, skip extender */
   if( g_opts.skip_blank_ext && (nim->num_ext == 0 || ! nim->ext_list ) ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d no exts and skip_blank_ext set, "
                        "so skipping 4-byte extender\n");
      return 0;
   }

   /* if invalid extension list, clear num_ext */
   if( ! valid_nifti_extensions(nim) ) nim->num_ext = 0;

   /* write out extender block */
   if( nim->num_ext > 0 ) extdr[0] = 1;
   if( nifti_write_buffer(fp, extdr, 4) != 4 ){
      fprintf(stderr,"** failed to write extender\n");
      return -1;
   }

   list = nim->ext_list;
   for ( c = 0; c < nim->num_ext; c++ ){
      size = (int)nifti_write_buffer(fp, &list->esize, sizeof(int));
      ok = (size == (int)sizeof(int));
      if( ok ){
         size = (int)nifti_write_buffer(fp, &list->ecode, sizeof(int));
         ok = (size == (int)sizeof(int));
      }
      if( ok ){
         size = (int)nifti_write_buffer(fp, list->edata, list->esize - 8);
         ok = (size == list->esize - 8);
      }

      if( !ok ){
         fprintf(stderr,"** failed while writing extension #%d\n",c);
         return -1;
      } else if ( g_opts.debug > 2 )
         fprintf(stderr,"+d wrote extension %d of %d bytes\n", c, size);

      list++;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d wrote out %d extension(s)\n", nim->num_ext);

   return nim->num_ext;
}